

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_elements_input_issuance_proof_init
              (wally_tx_input *input,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len)

{
  _Bool _Var1;
  int iVar2;
  uchar *p;
  uchar *new_issuance_amount_rangeproof;
  uchar *new_inflation_keys_rangeproof;
  
  new_issuance_amount_rangeproof = (uchar *)0x0;
  new_inflation_keys_rangeproof = (uchar *)0x0;
  iVar2 = -2;
  if (((issuance_amount_rangeproof != (uchar *)0x0) != (issuance_amount_rangeproof_len == 0)) &&
     ((inflation_keys_rangeproof != (uchar *)0x0) != (inflation_keys_rangeproof_len == 0))) {
    _Var1 = clone_bytes(&new_issuance_amount_rangeproof,issuance_amount_rangeproof,
                        issuance_amount_rangeproof_len);
    if (_Var1) {
      _Var1 = clone_bytes(&new_inflation_keys_rangeproof,inflation_keys_rangeproof,
                          inflation_keys_rangeproof_len);
      p = new_inflation_keys_rangeproof;
      if (_Var1) {
        input->issuance_amount_rangeproof = new_issuance_amount_rangeproof;
        input->issuance_amount_rangeproof_len = issuance_amount_rangeproof_len;
        input->inflation_keys_rangeproof = new_inflation_keys_rangeproof;
        input->inflation_keys_rangeproof_len = inflation_keys_rangeproof_len;
        return 0;
      }
    }
    else {
      p = (uchar *)0x0;
    }
    clear_and_free(new_issuance_amount_rangeproof,issuance_amount_rangeproof_len);
    clear_and_free(p,inflation_keys_rangeproof_len);
    iVar2 = -3;
  }
  return iVar2;
}

Assistant:

static int tx_elements_input_issuance_proof_init(
    struct wally_tx_input *input,
    const unsigned char *issuance_amount_rangeproof,
    size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof,
    size_t inflation_keys_rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *new_issuance_amount_rangeproof = NULL, *new_inflation_keys_rangeproof = NULL;
#endif
    (void) input;

    if (BYTES_INVALID(issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        BYTES_INVALID(inflation_keys_rangeproof, inflation_keys_rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_issuance_amount_rangeproof, issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        !clone_bytes(&new_inflation_keys_rangeproof, inflation_keys_rangeproof, inflation_keys_rangeproof_len)) {
        clear_and_free(new_issuance_amount_rangeproof, issuance_amount_rangeproof_len);
        clear_and_free(new_inflation_keys_rangeproof, inflation_keys_rangeproof_len);
        return WALLY_ENOMEM;
    }

    input->issuance_amount_rangeproof = new_issuance_amount_rangeproof;
    input->issuance_amount_rangeproof_len = issuance_amount_rangeproof_len;
    input->inflation_keys_rangeproof = new_inflation_keys_rangeproof;
    input->inflation_keys_rangeproof_len = inflation_keys_rangeproof_len;
#endif
    return WALLY_OK;
}